

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O3

header_used * __thiscall
first_fit_heap<64UL>::free_list_container::alloc(free_list_container *this,size_t size)

{
  char *pcVar1;
  size_t *psVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  iterator this_00;
  ulong uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  header_free *this_01;
  header_used *following;
  header_free *phVar7;
  iterator prev;
  iterator local_38;
  
  sVar4 = 0x40;
  if (0x40 < size) {
    sVar4 = size;
  }
  uVar5 = sVar4 + 0x3f & 0xffffffffffffffc0;
  sVar4 = 0x10;
  if (uVar5 != 0) {
    sVar4 = uVar5;
  }
  local_38.block = (header_free *)0x0;
  this_00 = first_free(this,sVar4,&local_38);
  if (this_00.block != (header_free *)0x0) {
    uVar5 = (((this_00.block)->super_header_used).raw & 0x3fffffffffffffff) - sVar4;
    if (0x4f < uVar5) {
      header_used::size(&(this_00.block)->super_header_used,sVar4);
      uVar6 = ((this_00.block)->super_header_used).raw & 0x3fffffffffffffff;
      phVar7 = (header_free *)((long)(&(this_00.block)->super_header_used + 1) + uVar6);
      *(ulong *)((long)(&((this_00.block)->super_header_used).
                         super_prepend_alignment_if_greater<16,_64UL> + 1) + uVar6 + 8) = uVar6;
      iVar3 = (*this->mem->_vptr_memory[4])();
      this_01 = (header_free *)0x0;
      if (phVar7 < (header_free *)CONCAT44(extraout_var,iVar3)) {
        this_01 = phVar7;
      }
      (this_01->super_header_used).raw = 0;
      (this_01->super_header_used).canary = 0x1337133713371337;
      header_used::size(&this_01->super_header_used,uVar5 - 0x40);
      uVar5 = (this_01->super_header_used).raw;
      uVar6 = uVar5 & 0x3fffffffffffffff;
      *(ulong *)((long)(&(this_01->super_header_used).super_prepend_alignment_if_greater<16,_64UL> +
                       1) + uVar6 + 8) = uVar6;
      this_01->next_ = (this_00.block)->next_;
      (this_01->super_header_used).raw = uVar5 | 0xc000000000000000;
      (this_00.block)->next_ = this_01;
    }
    if (local_38.block == (header_free *)0x0) {
      this->list = (this_00.block)->next_;
    }
    else {
      (local_38.block)->next_ = (this_00.block)->next_;
    }
    uVar5 = ((this_00.block)->super_header_used).raw & 0x3fffffffffffffff;
    iVar3 = (*this->mem->_vptr_memory[4])();
    if ((long)(&(this_00.block)->super_header_used + 1) + uVar5 < CONCAT44(extraout_var_00,iVar3)) {
      pcVar1 = this_00.block[1].super_header_used.super_prepend_alignment_if_greater<16,_64UL>.
               align_chars + uVar5 + 0x2f;
      *pcVar1 = *pcVar1 & 0x7f;
    }
    psVar2 = &((this_00.block)->super_header_used).raw;
    *psVar2 = *psVar2 & 0xbfffffffffffffff;
  }
  return &(this_00.block)->super_header_used;
}

Assistant:

header_used *alloc(size_t size)
        {
            size = HEAP_MAX(size, ALIGNMENT);
            size = align(size);

            iterator prev;
            auto it = first_free(size, prev);

            if (it == end()) {
                return nullptr;
            }

            auto  &block          = **it;
            size_t size_remaining = block.size() - size;

            if (size_remaining < (sizeof(header_free) + sizeof(footer))) {
                // remaining size cannot hold another block, use entire space
                size += size_remaining;
            } else {
                // split block into two
                block.size(size);
                block.update_footer();
                auto *new_block = new (block.following_block(mem)) header_free(size_remaining - sizeof(header_used));
                new_block->next(block.next());
                new_block->prev_free(true);
                block.next(new_block);
            }

            if (*prev) {
                (*prev)->next(block.next());
            } else {
                list = block.next();
            }

            auto *following = block.following_block(mem);
            if (following) {
                following->prev_free(false);
            }

            block.is_free(false);
            return &block;
        }